

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operands.c
# Opt level: O2

int GetAReg(char *op,int len,int loc)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = IsRegister(op,len);
  if ((uVar1 & 0xfffffff8) == 8) {
    iVar2 = uVar1 - 8;
  }
  else {
    Error(loc,8);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int 
GetAReg (char *op, int len, int loc)
/* Validate an address register specification.
 Valid specifications are A0 through A7, SP, or an EQUR label.
 The address register number will be returned if it is valid.
 Otherwise, Error will be called, using "loc" for the error
 location (this is its only use), and zero (A0) will be returned. */
{
	register int i;

	i = IsRegister(op, len); /* Get register number. */
	if ((i >= 8) && (i <= 15))
		return (i - 8); /* Valid address register */
	else {
		Error(loc, AddrErr); /* Not an address register */
		return (0); /* Set to A0. */
	}
}